

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O0

void __thiscall Num3072::Square(Num3072 *this)

{
  long lVar1;
  bool bVar2;
  limb_t *in_RDI;
  long in_FS_OFFSET;
  int j_1;
  int i_2;
  int i_1;
  int i;
  int j;
  limb_t d2;
  limb_t d1;
  limb_t d0;
  limb_t c2;
  limb_t c1;
  limb_t c0;
  Num3072 tmp;
  Num3072 *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  int iVar3;
  int in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe38;
  int iVar4;
  limb_t *a;
  limb_t *in_stack_fffffffffffffe48;
  limb_t *in_stack_fffffffffffffe50;
  limb_t *in_stack_fffffffffffffe58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  a = in_RDI;
  Num3072(in_stack_fffffffffffffe08);
  iVar4 = 0;
  while (iVar4 < 0x2f) {
    in_stack_fffffffffffffe58 = (limb_t *)0x0;
    in_stack_fffffffffffffe50 = (limb_t *)0x0;
    in_stack_fffffffffffffe48 = (limb_t *)0x0;
    for (in_stack_fffffffffffffe1c = 0; in_stack_fffffffffffffe1c < (0x2f - iVar4) / 2;
        in_stack_fffffffffffffe1c = in_stack_fffffffffffffe1c + 1) {
      anon_unknown.dwarf_35de1b1::muldbladd3
                (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,a,
                 (limb_t *)CONCAT44(iVar4,in_stack_fffffffffffffe1c));
    }
    in_stack_fffffffffffffe38 = in_stack_fffffffffffffe1c;
    if ((iVar4 + 1U & 1) != 0) {
      anon_unknown.dwarf_35de1b1::muladd3
                (in_stack_fffffffffffffe48,a,(limb_t *)CONCAT44(iVar4,in_stack_fffffffffffffe1c),
                 (limb_t *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 (limb_t *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    }
    in_stack_fffffffffffffe08 = (Num3072 *)&::(anonymous_namespace)::MAX_PRIME_DIFF;
    anon_unknown.dwarf_35de1b1::mulnadd3
              ((limb_t *)CONCAT44(iVar4,in_stack_fffffffffffffe38),
               (limb_t *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (limb_t *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),in_RDI,
               (limb_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
               (limb_t *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe50);
    for (in_stack_fffffffffffffe18 = 0; in_stack_fffffffffffffe18 < (iVar4 + 1) / 2;
        in_stack_fffffffffffffe18 = in_stack_fffffffffffffe18 + 1) {
      anon_unknown.dwarf_35de1b1::muldbladd3
                (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,a,
                 (limb_t *)CONCAT44(iVar4,in_stack_fffffffffffffe38));
    }
    in_stack_fffffffffffffe34 = in_stack_fffffffffffffe18;
    iVar3 = iVar4;
    if ((iVar4 + 1U & 1) != 0) {
      anon_unknown.dwarf_35de1b1::muladd3
                (in_stack_fffffffffffffe48,a,(limb_t *)CONCAT44(iVar4,in_stack_fffffffffffffe38),
                 (limb_t *)CONCAT44(in_stack_fffffffffffffe18,in_stack_fffffffffffffe30),
                 (limb_t *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      in_stack_fffffffffffffe14 = iVar4;
    }
    anon_unknown.dwarf_35de1b1::extract3
              ((limb_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
               (limb_t *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe08->limbs,(limb_t *)0x1b3acb4);
    iVar4 = iVar3 + 1;
  }
  for (iVar3 = 0; iVar3 < 0x18; iVar3 = iVar3 + 1) {
    anon_unknown.dwarf_35de1b1::muldbladd3
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,a,
               (limb_t *)CONCAT44(iVar4,in_stack_fffffffffffffe38));
  }
  anon_unknown.dwarf_35de1b1::extract3
            ((limb_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
             (limb_t *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe08->limbs,(limb_t *)0x1b3ad63);
  anon_unknown.dwarf_35de1b1::muln2
            ((limb_t *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),in_RDI,
             (limb_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  for (iVar4 = 0; iVar4 < 0x30; iVar4 = iVar4 + 1) {
    anon_unknown.dwarf_35de1b1::addnextract2
              ((limb_t *)CONCAT44(iVar4,in_stack_fffffffffffffe28),in_RDI,
               (limb_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
               (limb_t *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  }
  bVar2 = IsOverflow((Num3072 *)CONCAT44(in_stack_fffffffffffffe34,iVar3));
  if (bVar2) {
    FullReduce((Num3072 *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Num3072::Square()
{
    limb_t c0 = 0, c1 = 0, c2 = 0;
    Num3072 tmp;

    /* Compute limbs 0..N-2 of this*this into tmp, including one reduction. */
    for (int j = 0; j < LIMBS - 1; ++j) {
        limb_t d0 = 0, d1 = 0, d2 = 0;
        for (int i = 0; i < (LIMBS - 1 - j) / 2; ++i) muldbladd3(d0, d1, d2, this->limbs[i + j + 1], this->limbs[LIMBS - 1 - i]);
        if ((j + 1) & 1) muladd3(d0, d1, d2, this->limbs[(LIMBS - 1 - j) / 2 + j + 1], this->limbs[LIMBS - 1 - (LIMBS - 1 - j) / 2]);
        mulnadd3(c0, c1, c2, d0, d1, d2, MAX_PRIME_DIFF);
        for (int i = 0; i < (j + 1) / 2; ++i) muldbladd3(c0, c1, c2, this->limbs[i], this->limbs[j - i]);
        if ((j + 1) & 1) muladd3(c0, c1, c2, this->limbs[(j + 1) / 2], this->limbs[j - (j + 1) / 2]);
        extract3(c0, c1, c2, tmp.limbs[j]);
    }

    assert(c2 == 0);
    for (int i = 0; i < LIMBS / 2; ++i) muldbladd3(c0, c1, c2, this->limbs[i], this->limbs[LIMBS - 1 - i]);
    extract3(c0, c1, c2, tmp.limbs[LIMBS - 1]);

    /* Perform a second reduction. */
    muln2(c0, c1, MAX_PRIME_DIFF);
    for (int j = 0; j < LIMBS; ++j) {
        addnextract2(c0, c1, tmp.limbs[j], this->limbs[j]);
    }

    assert(c1 == 0);
    assert(c0 == 0 || c0 == 1);

    /* Perform up to two more reductions if the internal state has already
     * overflown the MAX of Num3072 or if it is larger than the modulus or
     * if both are the case.
     * */
    if (this->IsOverflow()) this->FullReduce();
    if (c0) this->FullReduce();
}